

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O0

int __thiscall xercesc_4_0::VecAttributesImpl::getIndex(VecAttributesImpl *this,XMLCh *qName)

{
  bool bVar1;
  XMLAttr *this_00;
  XMLCh *str1;
  XMLAttr *curElem;
  XMLSize_t index;
  XMLCh *qName_local;
  VecAttributesImpl *this_local;
  
  curElem = (XMLAttr *)0x0;
  while( true ) {
    if ((XMLAttr *)this->fCount <= curElem) {
      return -1;
    }
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                         (XMLSize_t)curElem);
    str1 = XMLAttr::getQName(this_00);
    bVar1 = XMLString::equals(str1,qName);
    if (bVar1) break;
    curElem = (XMLAttr *)&curElem->field_0x1;
  }
  return (int)curElem;
}

Assistant:

int VecAttributesImpl::getIndex(const XMLCh* const qName ) const
{
    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), qName))
            return (int)index ;
    }
    return -1;
}